

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::End(void)

{
  ImVector<ImGuiWindow_*> *this;
  int iVar1;
  ImGuiWindow *window;
  ImGuiContext *pIVar2;
  ImGuiWindow **ppIVar3;
  ImGuiWindow *window_00;
  
  pIVar2 = GImGui;
  iVar1 = (GImGui->CurrentWindowStack).Size;
  if (iVar1 < 2) {
    if (GImGui->FrameScopePushedImplicitWindow == true) {
      __assert_fail("g.CurrentWindowStack.Size > 1 && \"Calling End() too many times!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                    ,0x16c0,"void ImGui::End()");
    }
    if (iVar1 != 1) {
      __assert_fail("g.CurrentWindowStack.Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                    ,0x16c3,"void ImGui::End()");
    }
  }
  window = GImGui->CurrentWindow;
  if ((window->DC).CurrentColumns != (ImGuiColumns *)0x0) {
    EndColumns();
  }
  this = &pIVar2->CurrentWindowStack;
  PopClipRect();
  if ((window->Flags & 0x1000000) == 0) {
    LogFinish();
  }
  ImVector<ImGuiWindow_*>::pop_back(this);
  if ((window->Flags & 0x4000000) != 0) {
    ImVector<ImGuiPopupData>::pop_back(&pIVar2->BeginPopupStack);
  }
  window_00 = (ImGuiWindow *)0x0;
  CheckStacksSize(window,false);
  if (this->Size != 0) {
    ppIVar3 = ImVector<ImGuiWindow_*>::back(this);
    window_00 = *ppIVar3;
  }
  SetCurrentWindow(window_00);
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;

    if (g.CurrentWindowStack.Size <= 1 && g.FrameScopePushedImplicitWindow)
    {
        IM_ASSERT(g.CurrentWindowStack.Size > 1 && "Calling End() too many times!");
        return; // FIXME-ERRORHANDLING
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    ImGuiWindow* window = g.CurrentWindow;

    if (window->DC.CurrentColumns)
        EndColumns();
    PopClipRect();   // Inner window clip rectangle

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Pop from window stack
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    CheckStacksSize(window, false);
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
}